

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O0

int __thiscall XMLParser::XMLNode::indexText(XMLNode *this,char *lpszValue)

{
  int iVar1;
  char **p;
  int l;
  int i;
  char *lpszValue_local;
  XMLNode *this_local;
  
  if (this->d == (XMLNodeData *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    iVar1 = this->d->nText;
    if (lpszValue == (char *)0x0) {
      if (iVar1 == 0) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < iVar1; p._4_4_ = p._4_4_ + 1) {
        if (lpszValue == this->d->pText[p._4_4_]) {
          return p._4_4_;
        }
      }
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int XMLNode::indexText(XMLCSTR lpszValue) const
    {
        if(!d)
            return -1;
        int i, l = d->nText;
        if(!lpszValue)
        {
            if(l)
                return 0;
            return -1;
        }
        XMLCSTR * p = d->pText;
        for(i = 0; i < l; i++)
            if(lpszValue == p[i])
                return i;
        return -1;
    }